

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModuleBuilder.h
# Opt level: O0

void __thiscall
Refal2::CNamedQualifierInfo::CNamedQualifierInfo(CNamedQualifierInfo *this,CToken *nameToken)

{
  CToken *nameToken_local;
  CNamedQualifierInfo *this_local;
  
  CToken::CToken(&this->NameToken,nameToken);
  CQualifier::CQualifier(&this->qualifier);
  return;
}

Assistant:

CNamedQualifierInfo( const CToken& nameToken ): NameToken( nameToken ) {}